

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O2

int NV21ToRGB24Matrix(uint8_t *src_y,int src_stride_y,uint8_t *src_vu,int src_stride_vu,
                     uint8_t *dst_rgb24,int dst_stride_rgb24,YuvConstants *yuvconstants,int width,
                     int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  code *pcVar4;
  uint local_40;
  
  if (height == 0 ||
      (width < 1 ||
      (dst_rgb24 == (uint8_t *)0x0 || (src_vu == (uint8_t *)0x0 || src_y == (uint8_t *)0x0)))) {
    iVar1 = -1;
  }
  else {
    if (height < 0) {
      local_40 = -height;
      dst_rgb24 = dst_rgb24 + ~height * dst_stride_rgb24;
      dst_stride_rgb24 = -dst_stride_rgb24;
    }
    else {
      local_40 = height;
    }
    iVar1 = libyuv::TestCpuFlag(0x40);
    if ((width & 0xfU) == 0) {
      pcVar4 = NV21ToRGB24Row_SSSE3;
    }
    else {
      pcVar4 = NV21ToRGB24Row_Any_SSSE3;
    }
    if (iVar1 == 0) {
      pcVar4 = NV21ToRGB24Row_C;
    }
    iVar1 = libyuv::TestCpuFlag(0x400);
    if ((width & 0x1fU) == 0) {
      pcVar3 = NV21ToRGB24Row_AVX2;
    }
    else {
      pcVar3 = NV21ToRGB24Row_Any_AVX2;
    }
    if (iVar1 == 0) {
      pcVar3 = pcVar4;
    }
    for (uVar2 = 0; local_40 != uVar2; uVar2 = uVar2 + 1) {
      (*pcVar3)(src_y,src_vu,dst_rgb24,yuvconstants,width);
      dst_rgb24 = dst_rgb24 + dst_stride_rgb24;
      src_y = src_y + src_stride_y;
      src_vu = src_vu + (int)(-(uVar2 & 1) & src_stride_vu);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int NV21ToRGB24Matrix(const uint8_t* src_y,
                      int src_stride_y,
                      const uint8_t* src_vu,
                      int src_stride_vu,
                      uint8_t* dst_rgb24,
                      int dst_stride_rgb24,
                      const struct YuvConstants* yuvconstants,
                      int width,
                      int height) {
  int y;
  void (*NV21ToRGB24Row)(
      const uint8_t* y_buf, const uint8_t* uv_buf, uint8_t* rgb_buf,
      const struct YuvConstants* yuvconstants, int width) = NV21ToRGB24Row_C;
  if (!src_y || !src_vu || !dst_rgb24 || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_rgb24 = dst_rgb24 + (height - 1) * dst_stride_rgb24;
    dst_stride_rgb24 = -dst_stride_rgb24;
  }
#if defined(HAS_NV21TORGB24ROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    NV21ToRGB24Row = NV21ToRGB24Row_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      NV21ToRGB24Row = NV21ToRGB24Row_NEON;
    }
  }
#endif
#if defined(HAS_NV21TORGB24ROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    NV21ToRGB24Row = NV21ToRGB24Row_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      NV21ToRGB24Row = NV21ToRGB24Row_SSSE3;
    }
  }
#endif
#if defined(HAS_NV21TORGB24ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    NV21ToRGB24Row = NV21ToRGB24Row_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      NV21ToRGB24Row = NV21ToRGB24Row_AVX2;
    }
  }
#endif
#if defined(HAS_NV21TORGB24ROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    NV21ToRGB24Row = NV21ToRGB24Row_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      NV21ToRGB24Row = NV21ToRGB24Row_MMI;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    NV21ToRGB24Row(src_y, src_vu, dst_rgb24, yuvconstants, width);
    dst_rgb24 += dst_stride_rgb24;
    src_y += src_stride_y;
    if (y & 1) {
      src_vu += src_stride_vu;
    }
  }
  return 0;
}